

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O2

QByteArray * escapedString(QByteArray *__return_storage_ptr__,QStringView s)

{
  char16_t *pcVar1;
  uchar *puVar2;
  uchar *puVar3;
  char16_t u;
  char cVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  uchar uVar8;
  byte bVar9;
  long lVar10;
  qsizetype size;
  P _a;
  char16_t *end;
  uchar *puVar11;
  char *pcVar12;
  long in_FS_OFFSET;
  char16_t *src;
  uchar *local_40;
  long local_38;
  
  lVar10 = s.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  size = 0x10;
  if (0x10 < lVar10) {
    size = lVar10;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
  local_40 = (uchar *)(__return_storage_ptr__->d).ptr;
  if (local_40 == (uchar *)0x0) {
    local_40 = (uchar *)&QByteArray::_empty;
  }
  puVar11 = local_40 + (__return_storage_ptr__->d).size;
  end = s.m_data + lVar10;
  src = s.m_data;
  do {
    while( true ) {
      while( true ) {
        puVar2 = local_40;
        if (src == end) {
          pcVar12 = (__return_storage_ptr__->d).ptr;
          if (pcVar12 == (char *)0x0) {
            pcVar12 = &QByteArray::_empty;
          }
          QByteArray::resize(__return_storage_ptr__,(long)local_40 - (long)pcVar12);
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
            __stack_chk_fail();
          }
          return __return_storage_ptr__;
        }
        if (puVar11 + -6 <= local_40) {
          pcVar12 = (__return_storage_ptr__->d).ptr;
          if (pcVar12 == (char *)0x0) {
            pcVar12 = &QByteArray::_empty;
          }
          QByteArray::resize(__return_storage_ptr__,(__return_storage_ptr__->d).size * 2);
          local_40 = (uchar *)QByteArray::data(__return_storage_ptr__);
          local_40 = (uchar *)((char *)local_40 + ((long)puVar2 - (long)pcVar12));
          pcVar12 = (__return_storage_ptr__->d).ptr;
          if (pcVar12 == (char *)0x0) {
            pcVar12 = &QByteArray::_empty;
          }
          puVar11 = (uchar *)(pcVar12 + (__return_storage_ptr__->d).size);
        }
        pcVar1 = src + 1;
        u = *src;
        src = pcVar1;
        if ((ushort)u < 0x80) break;
        iVar7 = QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>
                          (u,&local_40,&src,end);
        if (iVar7 < 0) {
          *local_40 = '\\';
          local_40[1] = 'u';
          bVar9 = (byte)((ushort)u >> 8);
          bVar5 = (bVar9 >> 4) + 0x57;
          if ((ushort)u < 0xa000) {
            bVar5 = bVar9 >> 4 | 0x30;
          }
          local_40[2] = bVar5;
          uVar6 = (ushort)u >> 8 & 0xf;
          cVar4 = (char)uVar6;
          uVar8 = cVar4 + 'W';
          if (uVar6 < 10) {
            uVar8 = cVar4 + '0';
          }
          local_40[3] = uVar8;
          uVar6 = (ushort)u >> 4 & 0xf;
          cVar4 = (char)uVar6;
          uVar8 = cVar4 + 'W';
          if (uVar6 < 10) {
            uVar8 = cVar4 + '0';
          }
          local_40[4] = uVar8;
          cVar4 = (char)(u & 0xfU);
          uVar8 = cVar4 + 'W';
          if ((ushort)(u & 0xfU) < 10) {
            uVar8 = cVar4 + '0';
          }
          local_40[5] = uVar8;
          local_40 = local_40 + 6;
        }
      }
      if ((((ushort)u < 0x20) || (u == L'\\')) || (u == L'\"')) break;
      *local_40 = (uchar)u;
      local_40 = local_40 + 1;
    }
    puVar2 = local_40 + 1;
    *local_40 = '\\';
    puVar3 = local_40 + 2;
    switch(u) {
    case L'\b':
      *puVar2 = 'b';
      local_40 = puVar3;
      break;
    case L'\t':
      *puVar2 = 't';
      local_40 = puVar3;
      break;
    case L'\n':
      *puVar2 = 'n';
      local_40 = puVar3;
      break;
    case L'\v':
switchD_002caadb_caseD_b:
      *puVar2 = 'u';
      *puVar3 = '0';
      local_40[3] = '0';
      local_40[4] = (byte)((ushort)u >> 4) | 0x30;
      bVar5 = (byte)(u & 0xfU);
      bVar9 = bVar5 + 0x57;
      if ((ushort)(u & 0xfU) < 10) {
        bVar9 = bVar5 | 0x30;
      }
      local_40[5] = bVar9;
      local_40 = local_40 + 6;
      break;
    case L'\f':
      *puVar2 = 'f';
      local_40 = puVar3;
      break;
    case L'\r':
      *puVar2 = 'r';
      local_40 = puVar3;
      break;
    default:
      if (u == L'\\') {
        *puVar2 = '\\';
        local_40 = puVar3;
      }
      else {
        if (u != L'\"') goto switchD_002caadb_caseD_b;
        *puVar2 = '\"';
        local_40 = puVar3;
      }
    }
  } while( true );
}

Assistant:

static QByteArray escapedString(QStringView s)
{
    // give it a minimum size to ensure the resize() below always adds enough space
    QByteArray ba(qMax(s.size(), 16), Qt::Uninitialized);

    auto ba_const_start = [&]() { return reinterpret_cast<const uchar *>(ba.constData()); };
    uchar *cursor = reinterpret_cast<uchar *>(const_cast<char *>(ba.constData()));
    const uchar *ba_end = cursor + ba.size();
    const char16_t *src = s.utf16();
    const char16_t *const end = s.utf16() + s.size();

    while (src != end) {
        if (cursor >= ba_end - 6) {
            // ensure we have enough space
            qptrdiff pos = cursor - ba_const_start();
            ba.resize(ba.size()*2);
            cursor = reinterpret_cast<uchar *>(ba.data()) + pos;
            ba_end = ba_const_start() + ba.size();
        }

        char16_t u = *src++;
        if (u < 0x80) {
            if (u < 0x20 || u == 0x22 || u == 0x5c) {
                *cursor++ = '\\';
                switch (u) {
                case 0x22:
                    *cursor++ = '"';
                    break;
                case 0x5c:
                    *cursor++ = '\\';
                    break;
                case 0x8:
                    *cursor++ = 'b';
                    break;
                case 0xc:
                    *cursor++ = 'f';
                    break;
                case 0xa:
                    *cursor++ = 'n';
                    break;
                case 0xd:
                    *cursor++ = 'r';
                    break;
                case 0x9:
                    *cursor++ = 't';
                    break;
                default:
                    *cursor++ = 'u';
                    *cursor++ = '0';
                    *cursor++ = '0';
                    *cursor++ = hexdig(u>>4);
                    *cursor++ = hexdig(u & 0xf);
               }
            } else {
                *cursor++ = (uchar)u;
            }
        } else if (QUtf8Functions::toUtf8<QUtf8BaseTraits>(u, cursor, src, end) < 0) {
            // failed to get valid utf8 use JSON escape sequence
            *cursor++ = '\\';
            *cursor++ = 'u';
            *cursor++ = hexdig(u>>12 & 0x0f);
            *cursor++ = hexdig(u>>8 & 0x0f);
            *cursor++ = hexdig(u>>4 & 0x0f);
            *cursor++ = hexdig(u & 0x0f);
        }
    }

    ba.resize(cursor - ba_const_start());
    return ba;
}